

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5DecodePoslist(int *pRc,Fts5Buffer *pBuf,u8 *a,int n)

{
  int iVar1;
  ulong in_RAX;
  uint uVar2;
  int iVal;
  undefined8 uStack_38;
  
  if (n < 1) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    uStack_38 = in_RAX;
    do {
      iVar1 = sqlite3Fts5GetVarint32(a + uVar2,(u32 *)((long)&uStack_38 + 4));
      uVar2 = uVar2 + iVar1;
      sqlite3Fts5BufferAppendPrintf(pRc,pBuf," %d",uStack_38 >> 0x20);
    } while ((int)uVar2 < n);
  }
  return uVar2;
}

Assistant:

static int fts5DecodePoslist(int *pRc, Fts5Buffer *pBuf, const u8 *a, int n){
  int iOff = 0;
  while( iOff<n ){
    int iVal;
    iOff += fts5GetVarint32(&a[iOff], iVal);
    sqlite3Fts5BufferAppendPrintf(pRc, pBuf, " %d", iVal);
  }
  return iOff;
}